

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::C_SignFinal
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pSignature,
          CK_ULONG_PTR pulSignatureLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  MacAlgorithm *pMVar3;
  CK_RV CVar4;
  long in_RCX;
  long in_RDI;
  Session *session;
  CK_ULONG_PTR in_stack_00000038;
  CK_BYTE_PTR in_stack_00000040;
  Session *in_stack_00000048;
  CK_RV local_8;
  
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    local_8 = 400;
  }
  else if (in_RCX == 0) {
    local_8 = 7;
  }
  else {
    this_00 = (Session *)
              HandleManager::getSession
                        ((HandleManager *)pSignature,(CK_SESSION_HANDLE)pulSignatureLen);
    if (this_00 == (Session *)0x0) {
      local_8 = 0xb3;
    }
    else {
      iVar2 = Session::getOpType(this_00);
      if ((iVar2 == 5) && (bVar1 = Session::getAllowMultiPartOp(this_00), bVar1)) {
        pMVar3 = Session::getMacOp(this_00);
        if (pMVar3 != (MacAlgorithm *)0x0) {
          CVar4 = MacSignFinal(in_stack_00000048,in_stack_00000040,in_stack_00000038);
          return CVar4;
        }
        CVar4 = AsymSignFinal(in_stack_00000048,in_stack_00000040,in_stack_00000038);
        return CVar4;
      }
      local_8 = 0x91;
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::C_SignFinal(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pSignature, CK_ULONG_PTR pulSignatureLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pulSignatureLen == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_SIGN || !session->getAllowMultiPartOp())
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacSignFinal(session, pSignature, pulSignatureLen);
	else
		return AsymSignFinal(session, pSignature, pulSignatureLen);
}